

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupRepres(Aig_Man_t *p)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar3;
  }
  Aig_ManCleanData(p);
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_24) {
      iVar1 = Aig_ManRegNum(p);
      Aig_ManSetRegNum(p_00,iVar1);
      iVar1 = Aig_ManCheck(p_00);
      if (iVar1 == 0) {
        printf("Aig_ManDupRepres: Check has failed.\n");
      }
      return p_00;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (pObj_00 != (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsNode(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsCi(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsCo(pObj_00);
          if (iVar1 == 0) {
            iVar1 = Aig_ObjIsConst1(pObj_00);
            if (iVar1 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                            ,0x3b5,"Aig_Man_t *Aig_ManDupRepres(Aig_Man_t *)");
            }
            pAVar4 = Aig_ManConst1(p_00);
            (pObj_00->field_5).pData = pAVar4;
          }
          else {
            pAVar4 = Aig_ObjChild0Repres(p,pObj_00);
            pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
            (pObj_00->field_5).pData = pAVar4;
          }
        }
        else {
          pAVar4 = Aig_ObjCreateCi(p_00);
          (pObj_00->field_5).pData = pAVar4;
          pAVar4 = Aig_ObjGetRepres(p,pObj_00);
          (pObj_00->field_5).pData = pAVar4;
        }
      }
      else {
        pAVar4 = Aig_ObjChild0Repres(p,pObj_00);
        p1 = Aig_ObjChild1Repres(p,pObj_00);
        pAVar4 = Aig_And(p_00,pAVar4,p1);
        (pObj_00->field_5).pData = pAVar4;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManDupRepres( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // start the HOP package
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Repres(p, pObj), Aig_ObjChild1Repres(p, pObj) );
        else if ( Aig_ObjIsCi(pObj) )
        {
            pObj->pData = Aig_ObjCreateCi(pNew);
            pObj->pData = Aig_ObjGetRepres( p, pObj );
        }
        else if ( Aig_ObjIsCo(pObj) )
            pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Repres(p, pObj) );
        else if ( Aig_ObjIsConst1(pObj) )
            pObj->pData = Aig_ManConst1(pNew);
        else
            assert( 0 );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the new manager
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupRepres: Check has failed.\n" );
    return pNew;
}